

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::DataSegment::DataSegment(DataSegment *this,string_view name)

{
  Location local_48;
  undefined1 local_28 [8];
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  local_28 = (undefined1  [8])name.data_;
  string_view::to_string_abi_cxx11_(&this->name,(string_view *)local_28);
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  Var::Var(&this->memory_var,0xffffffff,&local_48);
  this->passive = false;
  (this->offset).first_ = (Expr *)0x0;
  (this->offset).last_ = (Expr *)0x0;
  (this->offset).size_ = 0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit DataSegment(string_view name) : name(name.to_string()) {}